

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O2

vw * VW::initialize(string *s,io_buf *model,bool skipModelLoad,trace_message_t trace_listener,
                   void *trace_context)

{
  int argc_00;
  char **argv;
  vw *pvVar1;
  int argc;
  int local_54;
  string local_50;
  
  local_54 = 0;
  std::__cxx11::string::string((string *)&local_50,(string *)s);
  argv = get_argv_from_string(&local_50,&local_54);
  std::__cxx11::string::~string((string *)&local_50);
  argc_00 = local_54;
  pvVar1 = initialize(local_54,argv,model,skipModelLoad,trace_listener,trace_context);
  free_args(argc_00,argv);
  return pvVar1;
}

Assistant:

vw* initialize(string s, io_buf* model, bool skipModelLoad, trace_message_t trace_listener, void* trace_context)
{
  int argc = 0;
  char** argv = get_argv_from_string(s, argc);
  vw* ret = nullptr;

  try
  {
    ret = initialize(argc, argv, model, skipModelLoad, trace_listener, trace_context);
  }
  catch (...)
  {
    free_args(argc, argv);
    throw;
  }

  free_args(argc, argv);
  return ret;
}